

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O2

void Cbs2_ObjCreateFanout(Cbs2_Man_t *p,int iObj,int iFan0,int iFan1)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  
  iVar1 = Abc_Var2Lit(iObj,0);
  p_00 = &p->vFanout0;
  iVar2 = Vec_IntEntry(p_00,iFan0);
  Vec_IntWriteEntry(&p->vFanoutN,iVar1,iVar2);
  iVar1 = Abc_Var2Lit(iObj,1);
  iVar2 = Vec_IntEntry(p_00,iFan1);
  Vec_IntWriteEntry(&p->vFanoutN,iVar1,iVar2);
  iVar1 = Abc_Var2Lit(iObj,0);
  Vec_IntWriteEntry(p_00,iFan0,iVar1);
  iVar1 = Abc_Var2Lit(iObj,1);
  Vec_IntWriteEntry(p_00,iFan1,iVar1);
  return;
}

Assistant:

void Cbs2_ObjCreateFanout( Cbs2_Man_t * p, int iObj, int iFan0, int iFan1 )
{
    Vec_IntWriteEntry( &p->vFanoutN, Abc_Var2Lit(iObj, 0), Vec_IntEntry(&p->vFanout0, iFan0) );
    Vec_IntWriteEntry( &p->vFanoutN, Abc_Var2Lit(iObj, 1), Vec_IntEntry(&p->vFanout0, iFan1) );
    Vec_IntWriteEntry( &p->vFanout0, iFan0, Abc_Var2Lit(iObj, 0) );
    Vec_IntWriteEntry( &p->vFanout0, iFan1, Abc_Var2Lit(iObj, 1) );
}